

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b.h
# Opt level: O0

bool FastPForLib::Simple8b<true>::tryme<240u,0u>(uint32_t *n,size_t len)

{
  uint local_24;
  uint32_t i;
  uint32_t minv;
  size_t len_local;
  uint32_t *n_local;
  
  local_24 = (uint)len;
  if (0xef < local_24) {
    local_24 = 0xf0;
  }
  i = 0;
  while( true ) {
    if (local_24 <= i) {
      return true;
    }
    if (n[i] != 0) break;
    i = i + 1;
  }
  return false;
}

Assistant:

static bool tryme(const uint32_t *n, size_t len) {
    if (log1 >= 32)
      return true;
    const uint32_t minv =
        (static_cast<uint32_t>(len) < num1) ? static_cast<uint32_t>(len) : num1;
    for (uint32_t i = 0; i < minv; i++) {
      if (n[i] >= (1U << (log1 % 32)))
        return false;
    }
    return true;
  }